

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_matrix_z2_boundary.cpp
# Opt level: O0

void __thiscall
Boundary_matrix_z2_row_access<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
::test_method(Boundary_matrix_z2_row_access<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
              *this)

{
  undefined1 local_1e0 [8];
  Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Boundary_matrix_z2_row_access<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
  *this_local;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>
              *)local_1e0,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,0xb);
  test_non_base_row_access<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
            ((Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>
              *)local_1e0);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>
  ::~Matrix((Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>
             *)local_1e0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Boundary_matrix_z2_row_access, Matrix, row_access_matrices) {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns);
  test_non_base_row_access<Matrix>(m);
}